

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs,CBS *cbs)

{
  bool bVar1;
  int local_2c;
  SSL *pSStack_28;
  int alert;
  SSL *ssl;
  CBS *cbs_local;
  SSL_HANDSHAKE *hs_local;
  
  pSStack_28 = hs->ssl;
  local_2c = 0x32;
  ssl = (SSL *)cbs;
  cbs_local = (CBS *)hs;
  bVar1 = ssl_scan_serverhello_tlsext(hs,cbs,&local_2c);
  if (bVar1) {
    bVar1 = ssl_check_serverhello_tlsext((SSL_HANDSHAKE *)cbs_local);
    if (bVar1) {
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  else {
    ssl_send_alert(pSStack_28,2,local_2c);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs, const CBS *cbs) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_serverhello_tlsext(hs, cbs, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_serverhello_tlsext(hs)) {
    return false;
  }

  return true;
}